

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

int If_CluCheckDecInAny(word t,int nVars)

{
  long lVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  
  if (0 < nVars) {
    uVar2 = (ulong)(uint)nVars;
    lVar9 = -5;
    uVar14 = 0;
    do {
      if (uVar14 == 6) {
LAB_004196ff:
        __assert_fail("iVar >= 0 && iVar < 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x337,"word Abc_Tt6Cofactor0(word, int)");
      }
      uVar4 = uVar14 + 1;
      if (uVar4 < uVar2) {
        bVar3 = (byte)(1 << ((byte)uVar14 & 0x1f));
        uVar13 = (ulong)(int)((uint)((s_Truths6Neg[uVar14] & t) << (bVar3 & 0x3f)) |
                             (uint)(s_Truths6Neg[uVar14] & t));
        uVar14 = (ulong)(int)((uint)((Truth6[uVar14] & t) >> (bVar3 & 0x3f)) |
                             (uint)(Truth6[uVar14] & t));
        lVar11 = lVar9;
        do {
          if (lVar11 == 0) goto LAB_004196ff;
          uVar6 = Truth6[lVar11] & uVar13;
          bVar3 = (byte)(1 << ((char)lVar11 + 6U & 0x1f));
          uVar5 = (uint)uVar6 | (uint)(uVar6 << (bVar3 & 0x3f));
          uVar6 = s_PPMasks[0][0][lVar11];
          uVar8 = uVar6 & uVar13;
          uVar7 = (uint)uVar8 | (uint)(uVar8 >> (bVar3 & 0x3f));
          uVar8 = Truth6[lVar11] & uVar14;
          uVar12 = (uint)uVar8 | (uint)(uVar8 << (bVar3 & 0x3f));
          uVar6 = uVar6 & uVar14;
          if ((uVar5 == uVar7) && (uVar5 == uVar12)) {
            return 1;
          }
          uVar10 = (uint)uVar6 | (uint)(uVar6 >> (bVar3 & 0x3f));
          if ((uVar5 == uVar12 || uVar5 == uVar7) && (uVar5 == uVar10)) {
            return 1;
          }
          if ((uVar7 == uVar12) && (uVar7 == uVar10)) {
            return 1;
          }
          lVar1 = lVar11 - uVar2;
          lVar11 = lVar11 + 1;
        } while (lVar1 != -7);
      }
      lVar9 = lVar9 + 1;
      uVar14 = uVar4;
    } while (uVar4 != uVar2);
  }
  return 0;
}

Assistant:

int If_CluCheckDecInAny( word t, int nVars )
{
    int v, u, Cof2[2], Cof4[4];
    for ( v = 0; v < nVars; v++ )
    {
        Cof2[0] = Abc_Tt6Cofactor0( t, v );
        Cof2[1] = Abc_Tt6Cofactor1( t, v );
        for ( u = v+1; u < nVars; u++ )
        {
            Cof4[0] = Abc_Tt6Cofactor0( Cof2[0], u );
            Cof4[1] = Abc_Tt6Cofactor1( Cof2[0], u );
            Cof4[2] = Abc_Tt6Cofactor0( Cof2[1], u );
            Cof4[3] = Abc_Tt6Cofactor1( Cof2[1], u );
            if ( Cof4[0] == Cof4[1] && Cof4[0] == Cof4[2] )
                return 1;
            if ( Cof4[0] == Cof4[2] && Cof4[0] == Cof4[3] )
                return 1;
            if ( Cof4[0] == Cof4[1] && Cof4[0] == Cof4[3] )
                return 1;
            if ( Cof4[1] == Cof4[2] && Cof4[1] == Cof4[3] )
                return 1;
        }
    }
    return 0;
}